

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void rtc::LogMultiline(LoggingSeverity level,char *label,bool input,void *data,size_t len,
                      bool hex_mode,LogMultilineState *state)

{
  byte bVar1;
  uchar *puVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  uchar *local_ad0;
  char *local_a48;
  LogMessage local_a38;
  LogMessageVoidify local_872;
  byte local_871;
  LogMessage local_870;
  LogMessageVoidify local_6a9;
  long local_6a8;
  size_type pos_private;
  string local_698 [8];
  string substr;
  LogMessage local_670;
  LogMessageVoidify local_4a9;
  byte *local_4a8;
  uchar *pos;
  undefined8 uStack_498;
  bool is_entirely_whitespace;
  ptrdiff_t kMinPrintableLine;
  byte *pbStack_488;
  bool is_printable;
  uchar *end_of_line;
  uchar *line;
  uchar *end;
  size_t consecutive_unprintable;
  LogMessage local_460;
  LogMessageVoidify local_29a;
  byte local_299;
  ulong uStack_298;
  uchar ch;
  size_t i;
  size_t line_len;
  char asc_line [25];
  char acStack_267 [7];
  char hex_line [56];
  size_t LINE_SIZE;
  uchar *udata;
  LogMessage local_208;
  LogMessageVoidify local_41;
  char *local_40;
  char *direction;
  size_t sStack_30;
  bool hex_mode_local;
  size_t len_local;
  void *data_local;
  char *pcStack_18;
  bool input_local;
  char *label_local;
  LoggingSeverity level_local;
  
  direction._7_1_ = hex_mode;
  sStack_30 = len;
  len_local = (size_t)data;
  data_local._7_1_ = input;
  pcStack_18 = label;
  label_local._4_4_ = level;
  bVar3 = LogCheckLevel(level);
  if (bVar3) {
    if ((data_local._7_1_ & 1) == 0) {
      local_a48 = " >> ";
    }
    else {
      local_a48 = " << ";
    }
    local_40 = local_a48;
    if (len_local == 0) {
      if ((state != (LogMultilineState *)0x0) &&
         (*(long *)(state + (ulong)(data_local._7_1_ & 1) * 8) != 0)) {
        bVar3 = LogMessage::Loggable(label_local._4_4_);
        if (bVar3) {
          LogMessageVoidify::LogMessageVoidify(&local_41);
          LogMessage::LogMessage
                    (&local_208,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                     ,0x1c2,label_local._4_4_,ERRCTX_NONE,0,(char *)0x0);
          poVar6 = LogMessage::stream(&local_208);
          poVar6 = std::operator<<(poVar6,pcStack_18);
          poVar6 = std::operator<<(poVar6,local_40);
          poVar6 = std::operator<<(poVar6,"## ");
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             (poVar6,*(ulong *)(state + (ulong)(data_local._7_1_ & 1) * 8));
          poVar6 = std::operator<<(poVar6," consecutive unprintable ##");
          LogMessageVoidify::operator&(&local_41,poVar6);
          LogMessage::~LogMessage(&local_208);
        }
        *(undefined8 *)(state + (ulong)(data_local._7_1_ & 1) * 8) = 0;
      }
    }
    else {
      LINE_SIZE = len_local;
      if ((direction._7_1_ & 1) == 0) {
        if (state == (LogMultilineState *)0x0) {
          local_ad0 = (uchar *)0x0;
        }
        else {
          local_ad0 = *(uchar **)(state + (ulong)(data_local._7_1_ & 1) * 8);
        }
        end = local_ad0;
        line = (uchar *)(len_local + sStack_30);
        while (LINE_SIZE < line) {
          end_of_line = (uchar *)LINE_SIZE;
          pbStack_488 = strchrn<unsigned_char>((uchar *)LINE_SIZE,(long)line - LINE_SIZE,'\n');
          if (pbStack_488 == (byte *)0x0) {
            pbStack_488 = line;
            LINE_SIZE = (size_t)line;
          }
          else {
            LINE_SIZE = (size_t)(pbStack_488 + 1);
          }
          kMinPrintableLine._7_1_ = 1;
          uStack_498 = 4;
          if ((end == (uchar *)0x0) || (3 < (long)pbStack_488 - (long)end_of_line)) {
            pos._7_1_ = 1;
            for (local_4a8 = end_of_line; local_4a8 < pbStack_488; local_4a8 = local_4a8 + 1) {
              iVar5 = isspace((uint)*local_4a8);
              if (iVar5 == 0) {
                pos._7_1_ = 0;
                iVar5 = isprint((uint)*local_4a8);
                if (iVar5 == 0) {
                  kMinPrintableLine._7_1_ = 0;
                  break;
                }
              }
            }
            if ((end != (uchar *)0x0) && ((pos._7_1_ & 1) != 0)) {
              kMinPrintableLine._7_1_ = 0;
            }
          }
          else {
            kMinPrintableLine._7_1_ = 0;
          }
          if ((kMinPrintableLine._7_1_ & 1) == 0) {
            end = end + (LINE_SIZE - (long)end_of_line);
          }
          else {
            if (end != (uchar *)0x0) {
              bVar3 = LogMessage::Loggable(label_local._4_4_);
              if (bVar3) {
                LogMessageVoidify::LogMessageVoidify(&local_4a9);
                LogMessage::LogMessage
                          (&local_670,
                           "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                           ,0x212,label_local._4_4_,ERRCTX_NONE,0,(char *)0x0);
                poVar6 = LogMessage::stream(&local_670);
                poVar6 = std::operator<<(poVar6,pcStack_18);
                poVar6 = std::operator<<(poVar6,local_40);
                poVar6 = std::operator<<(poVar6,"## ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)end);
                poVar6 = std::operator<<(poVar6," consecutive unprintable ##");
                LogMessageVoidify::operator&(&local_4a9,poVar6);
                LogMessage::~LogMessage(&local_670);
              }
              end = (uchar *)0x0;
            }
            while( true ) {
              bVar3 = false;
              if (end_of_line < pbStack_488) {
                iVar5 = isspace((uint)pbStack_488[-1]);
                bVar3 = iVar5 != 0;
              }
              puVar2 = end_of_line;
              if (!bVar3) break;
              pbStack_488 = pbStack_488 + -1;
            }
            uVar8 = (long)pbStack_488 - (long)end_of_line;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_698,(char *)puVar2,uVar8,(allocator *)((long)&pos_private + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&pos_private + 7));
            local_6a8 = std::__cxx11::string::find((char *)local_698,0x298bf3);
            if (local_6a8 == -1) {
              local_6a8 = std::__cxx11::string::find((char *)local_698,0x298bf9);
            }
            if (local_6a8 == -1) {
              local_871 = 0;
              bVar3 = LogMessage::Loggable(label_local._4_4_);
              if (bVar3) {
                LogMessageVoidify::LogMessageVoidify(&local_6a9);
                LogMessage::LogMessage
                          (&local_870,
                           "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                           ,0x221,label_local._4_4_,ERRCTX_NONE,0,(char *)0x0);
                local_871 = 1;
                poVar6 = LogMessage::stream(&local_870);
                poVar6 = std::operator<<(poVar6,pcStack_18);
                poVar6 = std::operator<<(poVar6,local_40);
                poVar6 = std::operator<<(poVar6,local_698);
                LogMessageVoidify::operator&(&local_6a9,poVar6);
              }
              if ((local_871 & 1) != 0) {
                LogMessage::~LogMessage(&local_870);
              }
            }
            else {
              bVar3 = LogMessage::Loggable(label_local._4_4_);
              if (bVar3) {
                LogMessageVoidify::LogMessageVoidify(&local_872);
                LogMessage::LogMessage
                          (&local_a38,
                           "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                           ,0x223,label_local._4_4_,ERRCTX_NONE,0,(char *)0x0);
                poVar6 = LogMessage::stream(&local_a38);
                poVar6 = std::operator<<(poVar6,pcStack_18);
                poVar6 = std::operator<<(poVar6,local_40);
                poVar6 = std::operator<<(poVar6,"## omitted for privacy ##");
                LogMessageVoidify::operator&(&local_872,poVar6);
                LogMessage::~LogMessage(&local_a38);
              }
            }
            std::__cxx11::string::~string(local_698);
          }
        }
        if (state != (LogMultilineState *)0x0) {
          *(uchar **)(state + (ulong)(data_local._7_1_ & 1) * 8) = end;
        }
      }
      else {
        hex_line[0x30] = '\x18';
        hex_line[0x31] = '\0';
        hex_line[0x32] = '\0';
        hex_line[0x33] = '\0';
        hex_line[0x34] = '\0';
        hex_line[0x35] = '\0';
        hex_line[0x36] = '\0';
        hex_line[0x37] = '\0';
        for (; sStack_30 != 0; sStack_30 = sStack_30 - i) {
          memset(&line_len,0x20,0x19);
          memset(asc_line + 0x18,0x20,0x38);
          puVar7 = std::min<unsigned_long>
                             (&stack0xffffffffffffffd0,(unsigned_long *)(hex_line + 0x30));
          i = *puVar7;
          for (uStack_298 = 0; uStack_298 < i; uStack_298 = uStack_298 + 1) {
            local_299 = *(byte *)(LINE_SIZE + uStack_298);
            iVar5 = isprint((uint)local_299);
            bVar1 = local_299;
            if (iVar5 == 0) {
              bVar1 = 0x2e;
            }
            asc_line[uStack_298 - 8] = bVar1;
            cVar4 = hex_encode((uchar)((int)(uint)local_299 >> 4));
            acStack_267[uStack_298 * 2 + (uStack_298 >> 2) + -1] = cVar4;
            cVar4 = hex_encode(local_299 & 0xf);
            acStack_267[uStack_298 * 2 + (uStack_298 >> 2)] = cVar4;
          }
          asc_line[0x10] = '\0';
          hex_line[0x2f] = '\0';
          bVar3 = LogMessage::Loggable(label_local._4_4_);
          consecutive_unprintable._7_1_ = 0;
          if (bVar3) {
            LogMessageVoidify::LogMessageVoidify(&local_29a);
            LogMessage::LogMessage
                      (&local_460,
                       "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/logging.cc"
                       ,0x1dc,label_local._4_4_,ERRCTX_NONE,0,(char *)0x0);
            consecutive_unprintable._7_1_ = 1;
            poVar6 = LogMessage::stream(&local_460);
            poVar6 = std::operator<<(poVar6,pcStack_18);
            poVar6 = std::operator<<(poVar6,local_40);
            poVar6 = std::operator<<(poVar6,(char *)&line_len);
            poVar6 = std::operator<<(poVar6," ");
            poVar6 = std::operator<<(poVar6,asc_line + 0x18);
            poVar6 = std::operator<<(poVar6," ");
            LogMessageVoidify::operator&(&local_29a,poVar6);
          }
          if ((consecutive_unprintable._7_1_ & 1) != 0) {
            LogMessage::~LogMessage(&local_460);
          }
          LINE_SIZE = i + LINE_SIZE;
        }
      }
    }
  }
  return;
}

Assistant:

void LogMultiline(LoggingSeverity level, const char* label, bool input,
                  const void* data, size_t len, bool hex_mode,
                  LogMultilineState* state) {
  if (!LOG_CHECK_LEVEL_V(level))
    return;

  const char * direction = (input ? " << " : " >> ");

  // NULL data means to flush our count of unprintable characters.
  if (!data) {
    if (state && state->unprintable_count_[input]) {
      LOG_V(level) << label << direction << "## "
                   << state->unprintable_count_[input]
                   << " consecutive unprintable ##";
      state->unprintable_count_[input] = 0;
    }
    return;
  }

  // The ctype classification functions want unsigned chars.
  const unsigned char* udata = static_cast<const unsigned char*>(data);

  if (hex_mode) {
    const size_t LINE_SIZE = 24;
    char hex_line[LINE_SIZE * 9 / 4 + 2], asc_line[LINE_SIZE + 1];
    while (len > 0) {
      memset(asc_line, ' ', sizeof(asc_line));
      memset(hex_line, ' ', sizeof(hex_line));
      size_t line_len = std::min(len, LINE_SIZE);
      for (size_t i = 0; i < line_len; ++i) {
        unsigned char ch = udata[i];
        asc_line[i] = isprint(ch) ? ch : '.';
        hex_line[i*2 + i/4] = hex_encode(ch >> 4);
        hex_line[i*2 + i/4 + 1] = hex_encode(ch & 0xf);
      }
      asc_line[sizeof(asc_line)-1] = 0;
      hex_line[sizeof(hex_line)-1] = 0;
      LOG_V(level) << label << direction
                   << asc_line << " " << hex_line << " ";
      udata += line_len;
      len -= line_len;
    }
    return;
  }

  size_t consecutive_unprintable = state ? state->unprintable_count_[input] : 0;

  const unsigned char* end = udata + len;
  while (udata < end) {
    const unsigned char* line = udata;
    const unsigned char* end_of_line = strchrn<unsigned char>(udata,
                                                              end - udata,
                                                              '\n');
    if (!end_of_line) {
      udata = end_of_line = end;
    } else {
      udata = end_of_line + 1;
    }

    bool is_printable = true;

    // If we are in unprintable mode, we need to see a line of at least
    // kMinPrintableLine characters before we'll switch back.
    const ptrdiff_t kMinPrintableLine = 4;
    if (consecutive_unprintable && ((end_of_line - line) < kMinPrintableLine)) {
      is_printable = false;
    } else {
      // Determine if the line contains only whitespace and printable
      // characters.
      bool is_entirely_whitespace = true;
      for (const unsigned char* pos = line; pos < end_of_line; ++pos) {
        if (isspace(*pos))
          continue;
        is_entirely_whitespace = false;
        if (!isprint(*pos)) {
          is_printable = false;
          break;
        }
      }
      // Treat an empty line following unprintable data as unprintable.
      if (consecutive_unprintable && is_entirely_whitespace) {
        is_printable = false;
      }
    }
    if (!is_printable) {
      consecutive_unprintable += (udata - line);
      continue;
    }
    // Print out the current line, but prefix with a count of prior unprintable
    // characters.
    if (consecutive_unprintable) {
      LOG_V(level) << label << direction << "## " << consecutive_unprintable
                  << " consecutive unprintable ##";
      consecutive_unprintable = 0;
    }
    // Strip off trailing whitespace.
    while ((end_of_line > line) && isspace(*(end_of_line-1))) {
      --end_of_line;
    }
    // Filter out any private data
    std::string substr(reinterpret_cast<const char*>(line), end_of_line - line);
    std::string::size_type pos_private = substr.find("Email");
    if (pos_private == std::string::npos) {
      pos_private = substr.find("Passwd");
    }
    if (pos_private == std::string::npos) {
      LOG_V(level) << label << direction << substr;
    } else {
      LOG_V(level) << label << direction << "## omitted for privacy ##";
    }
  }

  if (state) {
    state->unprintable_count_[input] = consecutive_unprintable;
  }
}